

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  ulong uVar1;
  bool local_191;
  bool local_161;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  string local_pname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  byte local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *name_local;
  Option *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  uVar1 = ::std::__cxx11::string::length();
  local_41 = 0;
  local_161 = false;
  if (2 < uVar1) {
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    local_41 = 1;
    local_161 = ::std::operator==(&local_40,"--");
  }
  if ((local_41 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  if (local_161 == false) {
    uVar1 = ::std::__cxx11::string::length();
    local_191 = false;
    if (1 < uVar1) {
      ::std::__cxx11::string::substr((ulong)&local_98,(ulong)name);
      local_191 = ::std::operator==(&local_98,"-");
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    if (local_191 == false) {
      ::std::__cxx11::string::string((string *)local_e0,(string *)&this->pname_);
      if (((this->super_OptionBase<CLI::Option>).ignore_case_ & 1U) != 0) {
        ::std::__cxx11::string::string((string *)&local_120,(string *)local_e0);
        detail::to_lower(&local_100,&local_120);
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_100);
        ::std::__cxx11::string::~string((string *)&local_120);
        ::std::__cxx11::string::string((string *)&local_160,(string *)name);
        detail::to_lower(&local_140,&local_160);
        ::std::__cxx11::string::operator=((string *)name,(string *)&local_140);
        ::std::__cxx11::string::~string((string *)&local_140);
        ::std::__cxx11::string::~string((string *)&local_160);
      }
      this_local._7_1_ =
           ::std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e0);
      ::std::__cxx11::string::~string((string *)local_e0);
    }
    else {
      ::std::__cxx11::string::substr
                ((ulong)(&local_pname.field_2._M_allocated_capacity + 1),(ulong)name);
      this_local._7_1_ =
           check_sname(this,(string *)(&local_pname.field_2._M_allocated_capacity + 1));
      ::std::__cxx11::string::~string((string *)(local_pname.field_2._M_local_buf + 8));
    }
  }
  else {
    ::std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
    this_local._7_1_ = check_lname(this,&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool check_name(std::string name) const {

        if(name.length() > 2 && name.substr(0, 2) == "--")
            return check_lname(name.substr(2));
        else if(name.length() > 1 && name.substr(0, 1) == "-")
            return check_sname(name.substr(1));
        else {
            std::string local_pname = pname_;
            if(ignore_case_) {
                local_pname = detail::to_lower(local_pname);
                name = detail::to_lower(name);
            }
            return name == local_pname;
        }
    }